

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout.cpp
# Opt level: O1

void __thiscall QGraphicsAnchorLayout::~QGraphicsAnchorLayout(QGraphicsAnchorLayout *this)

{
  QGraphicsAnchorLayoutPrivate *this_00;
  QGraphicsLayoutItem *this_01;
  bool bVar1;
  QGraphicsAnchorLayoutPrivate *d;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  (this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem =
       (_func_int **)&PTR__QGraphicsAnchorLayout_0081eff0;
  this_00 = (QGraphicsAnchorLayoutPrivate *)
            (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
  uVar2 = (uint)(this_00->items).d.size;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)(uVar2 & 0x7fffffff);
    do {
      uVar3 = uVar4 - 1;
      this_01 = (this_00->items).d.ptr[uVar3];
      (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[0xb])
                (this,uVar3 & 0xffffffff);
      if (this_01 != (QGraphicsLayoutItem *)0x0) {
        bVar1 = QGraphicsLayoutItem::ownedByLayout(this_01);
        if (bVar1) {
          (*this_01->_vptr_QGraphicsLayoutItem[1])(this_01);
        }
      }
      bVar1 = 1 < (long)uVar4;
      uVar4 = uVar3;
    } while (bVar1);
  }
  QGraphicsAnchorLayoutPrivate::removeCenterConstraints
            (this_00,(QGraphicsLayoutItem *)this,Horizontal);
  QGraphicsAnchorLayoutPrivate::removeCenterConstraints
            (this_00,(QGraphicsLayoutItem *)this,Vertical);
  QGraphicsAnchorLayoutPrivate::deleteLayoutEdges(this_00);
  QGraphicsLayout::~QGraphicsLayout(&this->super_QGraphicsLayout);
  return;
}

Assistant:

QGraphicsAnchorLayout::~QGraphicsAnchorLayout()
{
    Q_D(QGraphicsAnchorLayout);

    for (int i = count() - 1; i >= 0; --i) {
        QGraphicsLayoutItem *item = d->items.at(i);
        removeAt(i);
        if (item) {
            if (item->ownedByLayout())
                delete item;
        }
    }

    d->removeCenterConstraints(this, Qt::Horizontal);
    d->removeCenterConstraints(this, Qt::Vertical);
    d->deleteLayoutEdges();

    Q_ASSERT(d->itemCenterConstraints[Qt::Horizontal].isEmpty());
    Q_ASSERT(d->itemCenterConstraints[Qt::Vertical].isEmpty());
    Q_ASSERT(d->items.isEmpty());
    Q_ASSERT(d->m_vertexList.isEmpty());
}